

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O1

void quantize_float(JCOEFPTR coef_block,float *divisors,float *workspace)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  lVar3 = 0;
  do {
    pfVar1 = workspace + lVar3;
    pfVar2 = divisors + lVar3;
    auVar4._0_4_ = (int)(*pfVar2 * *pfVar1 + 16384.5);
    auVar4._4_4_ = (int)(pfVar2[1] * pfVar1[1] + 16384.5);
    auVar4._8_4_ = (int)(pfVar2[2] * pfVar1[2] + 16384.5);
    auVar4._12_4_ = (int)(pfVar2[3] * pfVar1[3] + 16384.5);
    auVar4 = pshuflw(auVar4,auVar4,0xe8);
    auVar4 = pshufhw(auVar4,auVar4,0xe8);
    *(ulong *)(coef_block + lVar3) =
         CONCAT26(auVar4._10_2_ + -0x4000,
                  CONCAT24(auVar4._8_2_ + -0x4000,
                           CONCAT22(auVar4._2_2_ + -0x4000,auVar4._0_2_ + -0x4000)));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

METHODDEF(void)
quantize_float(JCOEFPTR coef_block, FAST_FLOAT *divisors,
               FAST_FLOAT *workspace)
{
  register FAST_FLOAT temp;
  register int i;
  register JCOEFPTR output_ptr = coef_block;

  for (i = 0; i < DCTSIZE2; i++) {
    /* Apply the quantization and scaling factor */
    temp = workspace[i] * divisors[i];

    /* Round to nearest integer.
     * Since C does not specify the direction of rounding for negative
     * quotients, we have to force the dividend positive for portability.
     * The maximum coefficient size is +-16K (for 12-bit data), so this
     * code should work for either 16-bit or 32-bit ints.
     */
    output_ptr[i] = (JCOEF)((int)(temp + (FAST_FLOAT)16384.5) - 16384);
  }
}